

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::SummaryFunctionBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  vector<duckdb::LogicalType,_true> *this_00;
  undefined8 in_RAX;
  reference __x;
  reference __args;
  idx_t i;
  ulong __n;
  
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [8])"summary");
  for (__n = 0; this_00 = input->input_table_types,
      __n < (ulong)(((long)(this_00->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18); __n = __n + 1) {
    __x = vector<duckdb::LogicalType,_true>::get<true>(this_00,__n);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&return_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
    __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(input->input_table_names,__n);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,__args);
  }
  make_uniq<duckdb::TableFunctionData>();
  *(undefined8 *)this = in_RAX;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> SummaryFunctionBind(ClientContext &context, TableFunctionBindInput &input,
                                                    vector<LogicalType> &return_types, vector<string> &names) {

	return_types.emplace_back(LogicalType::VARCHAR);
	names.emplace_back("summary");

	for (idx_t i = 0; i < input.input_table_types.size(); i++) {
		return_types.push_back(input.input_table_types[i]);
		names.emplace_back(input.input_table_names[i]);
	}

	return make_uniq<TableFunctionData>();
}